

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_uv_rsn(REF_DBL *uv,REF_DBL *r,REF_DBL *s,REF_DBL *n,REF_DBL *drsduv)

{
  REF_STATUS RVar1;
  long lVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    r[lVar2] = uv[lVar2];
  }
  *drsduv = 1.0;
  drsduv[1] = 0.0;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    s[lVar2] = uv[lVar2 + 3];
  }
  drsduv[2] = 0.0;
  drsduv[3] = 1.0;
  auVar6._0_8_ = SQRT(r[2] * r[2] + *r * *r + r[1] * r[1]);
  auVar6._8_8_ = auVar6._0_8_;
  auVar6 = divpd(*(undefined1 (*) [16])drsduv,auVar6);
  *(undefined1 (*) [16])drsduv = auVar6;
  RVar1 = ref_math_normalize(r);
  if (RVar1 == 0) {
    auVar4._0_8_ = SQRT(s[2] * s[2] + *s * *s + s[1] * s[1]);
    auVar4._8_8_ = auVar4._0_8_;
    auVar6 = divpd(*(undefined1 (*) [16])(drsduv + 2),auVar4);
    *(undefined1 (*) [16])(drsduv + 2) = auVar6;
    RVar1 = ref_math_normalize(s);
    if (RVar1 == 0) {
      dVar3 = -(r[2] * s[2] + *r * *s + r[1] * s[1]);
      for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
        s[lVar2] = r[lVar2] * dVar3 + s[lVar2];
      }
      auVar5._0_8_ = dVar3 * *drsduv + drsduv[2];
      auVar5._8_8_ = dVar3 * drsduv[1] + drsduv[3];
      *(undefined1 (*) [16])(drsduv + 2) = auVar5;
      auVar7._0_8_ = SQRT(s[2] * s[2] + *s * *s + s[1] * s[1]);
      auVar7._8_8_ = auVar7._0_8_;
      auVar6 = divpd(auVar5,auVar7);
      *(undefined1 (*) [16])(drsduv + 2) = auVar6;
      RVar1 = ref_math_normalize(s);
      if (RVar1 == 0) {
        *n = r[1] * s[2] - s[1] * r[2];
        n[1] = r[2] * *s - s[2] * *r;
        n[2] = *r * s[1] - *s * r[1];
        RVar1 = 0;
      }
    }
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_uv_rsn(REF_DBL *uv, REF_DBL *r, REF_DBL *s,
                                   REF_DBL *n, REF_DBL *drsduv) {
  REF_INT i;
  REF_DBL dot;
  REF_DBL len;

  for (i = 0; i < 3; i++) r[i] = uv[i];
  drsduv[0] = 1.0;
  drsduv[1] = 0.0;
  for (i = 0; i < 3; i++) s[i] = uv[i + 3];
  drsduv[2] = 0.0;
  drsduv[3] = 1.0;
  len = sqrt(ref_math_dot(r, r));
  drsduv[0] /= len;
  drsduv[1] /= len;
  RAISE(ref_math_normalize(r));
  len = sqrt(ref_math_dot(s, s));
  drsduv[2] /= len;
  drsduv[3] /= len;
  RAISE(ref_math_normalize(s));

  dot = ref_math_dot(r, s);
  for (i = 0; i < 3; i++) s[i] -= dot * r[i];
  drsduv[2] -= dot * drsduv[0];
  drsduv[3] -= dot * drsduv[1];

  len = sqrt(ref_math_dot(s, s));
  drsduv[2] /= len;
  drsduv[3] /= len;
  RAISE(ref_math_normalize(s));

  ref_math_cross_product(r, s, n);

  return REF_SUCCESS;
}